

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

int set_representative_proc(Am_Object *self)

{
  ushort uVar1;
  byte bVar2;
  Am_Value *pAVar3;
  ushort uVar4;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40 [8];
  Am_Value_List l;
  Am_Object local_20;
  Am_Object example;
  Am_String class_name;
  Am_Object *self_local;
  
  uVar4 = (ushort)self;
  pAVar3 = (Am_Value *)Am_Object::Get(uVar4,(ulong)(ushort)CLASS_NAME);
  Am_String::Am_String((Am_String *)&example,pAVar3);
  Am_Object::Am_Object(&local_20);
  pAVar3 = (Am_Value *)Am_Object::Get(uVar4,(ulong)(ushort)CLASS_EXAMPLES);
  Am_Value_List::Am_Value_List(local_40,pAVar3);
  Am_Value_List::Start();
  bVar2 = Am_Value_List::Last();
  if ((bVar2 & 1) == 0) {
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(&local_50,pAVar3);
    Am_Object::Copy((char *)&local_48);
    Am_Object::operator=(&local_20,(Am_Object *)&local_48);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Object::Remove_Part(uVar4);
  uVar1 = (ushort)CLASS_REPRESENTATIVE;
  Am_Object::Am_Object(&local_58,(Am_Object *)&local_20);
  Am_Object::Add_Part(uVar4,(Am_Object *)(ulong)uVar1,(ulong)&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(local_40);
  Am_Object::~Am_Object(&local_20);
  Am_String::~Am_String((Am_String *)&example);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_representative)
{
  Am_String class_name = self.Get(CLASS_NAME);
  //   Am_Value_List l = trainer.Get_Examples (class_name);
  //   Am_Object example;

  //   l.Start ();
  //   if (!l.Last())
  //     example = Example_Create (l.Get());

  Am_Object example;
  Am_Value_List l = self.Get(CLASS_EXAMPLES);
  l.Start();
  if (!l.Last())
    example = Am_Object(l.Get()).Copy();

  self.Remove_Part(CLASS_REPRESENTATIVE);
  self.Add_Part(CLASS_REPRESENTATIVE, example);
  //  cout << "Class " << self << " represented by " << example << endl;
  return 1;
}